

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O1

void __thiscall
tvm::runtime::WorkspacePool::FreeWorkspace(WorkspacePool *this,TVMContext ctx,void *ptr)

{
  pointer ppPVar1;
  ulong uVar2;
  LogMessageFatal LStack_1a8;
  
  uVar2 = (long)ctx >> 0x20;
  ppPVar1 = (this->array_).
            super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(this->array_).
                     super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar2) ||
     (ppPVar1[uVar2] == (Pool *)0x0)) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
               ,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_1a8,
               "Check failed: static_cast<size_t>(ctx.device_id) < array_.size() && array_[ctx.device_id] != nullptr"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal(&LStack_1a8);
  }
  Pool::Free((this->array_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2],ptr);
  return;
}

Assistant:

void WorkspacePool::FreeWorkspace(TVMContext ctx, void *ptr) {
  CHECK(static_cast<size_t>(ctx.device_id) < array_.size() &&
        array_[ctx.device_id] != nullptr);
  array_[ctx.device_id]->Free(ptr);
}